

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen1_2x3.cpp
# Opt level: O2

void Assimp::IFC::Schema_2x3::GetSchema(ConversionSchema *out)

{
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>_>
  local_40;
  
  STEP::EXPRESS::ConversionSchema::ConversionSchema<980ul>
            ((ConversionSchema *)&local_40,
             (SchemaEntry (*) [980])Assimp::(anonymous_namespace)::schema_raw_2x3);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>_>
  ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>_>
               *)out,&local_40);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>_>
  ::~_Rb_tree(&local_40);
  return;
}

Assistant:

void IFC::Schema_2x3::GetSchema(EXPRESS::ConversionSchema& out) {
	out = EXPRESS::ConversionSchema(schema_raw_2x3);
}